

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

PSNode * __thiscall
dg::pta::PointerGraph::create<(dg::pta::PSNodeType)9,dg::pta::PSNode*&>
          (PointerGraph *this,PSNode **args)

{
  type __args;
  PointerGraph *in_RSI;
  PSNode *n;
  PSNode **in_stack_ffffffffffffffe8;
  
  __args = nodeFactory<(dg::pta::PSNodeType)9,dg::pta::PSNode*&,dg::pta::PSNodeCall>
                     (in_RSI,in_stack_ffffffffffffffe8);
  std::
  vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
  ::emplace_back<dg::pta::PSNode*&>
            ((vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
              *)in_RSI,(PSNode **)__args);
  return &__args->super_PSNode;
}

Assistant:

PSNode *create(Args &&...args) {
        PSNode *n = nodeFactory<Type>(std::forward<Args>(args)...);
        nodes.emplace_back(n); // C++17 returns a referece
        assert(n->getID() == nodes.size() - 1);
        return n;
    }